

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O2

int __thiscall ncnn::Crop_x86::forward(Crop_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  _func_int *p_Var1;
  uint uVar2;
  Option *pOVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  Mat *pMVar7;
  int q;
  uint uVar8;
  void *__arg;
  int _elempack;
  int _outw;
  int _outh;
  int local_194;
  Mat *local_190;
  int local_184;
  int _woffset;
  int _outc;
  int _outd;
  int _hoffset;
  Option *local_170;
  int local_164;
  int local_160;
  int _coffset;
  int local_158;
  int _doffset;
  Mat bottom_blob_unpacked;
  Mat m;
  Mat borderm;
  Mat local_78;
  
  iVar4 = bottom_blob->elempack;
  local_190 = top_blob;
  if (iVar4 == 4) {
    local_194 = bottom_blob->w;
    local_184 = bottom_blob->h;
    local_160 = bottom_blob->d;
    local_164 = bottom_blob->c;
    iVar6 = bottom_blob->dims;
    uVar5 = bottom_blob->elemsize;
    p_Var1 = this->_vptr_Crop_x86[-3];
    local_170 = opt;
    local_158 = iVar4;
    Mat::shape(&bottom_blob_unpacked,bottom_blob);
    Crop::resolve_crop_roi
              ((Crop *)((long)&this->_vptr_Crop_x86 + (long)p_Var1),&bottom_blob_unpacked,&_woffset,
               &_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
    Mat::~Mat(&bottom_blob_unpacked);
    pMVar7 = local_190;
    opt = local_170;
    iVar4 = local_158;
    if (iVar6 - 1U < 4) {
      uVar8 = _outc >> 2;
      switch(iVar6) {
      case 1:
        uVar8 = _outw & 3;
        _elempack = (uint)(uVar8 == 0) * 3 + 1;
        iVar6 = _outw / _elempack;
        if (local_194 == iVar6 && uVar8 == 0) {
LAB_001a8dfa:
          Mat::operator=(local_190,bottom_blob);
          return 0;
        }
        if (((_outw | _woffset) & 3U) == 0) {
          Mat::create(local_190,iVar6,(uVar5 >> 2) << (uVar8 == 0) * '\x02',_elempack,
                      local_170->blob_allocator);
          if (pMVar7->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar7->c * pMVar7->cstep != 0) {
            crop_pack4_sse(bottom_blob,pMVar7,0,_woffset / 4);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        if (((_outw == local_194) && ((_outh & 3U) == 0)) &&
           (_outh / (int)((uint)((_outh & 3U) == 0) * 3 + 1) == local_184)) goto LAB_001a8dfa;
        if (((_hoffset | _outh) & 3U) == 0) {
          Mat::create(local_190,_outw,_outh >> 2,(uVar5 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                      local_170->blob_allocator);
          if (pMVar7->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar7->c * pMVar7->cstep != 0) {
            crop_pack4_sse(bottom_blob,pMVar7,_hoffset / 4,_woffset);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar2 = _outc & 3;
        if ((((_outw == local_194) && (_outh == local_184)) && ((_outc & 3U) == 0)) &&
           (_outc / (int)((uint)((_outc & 3U) == 0) * 3 + 1) == local_164)) goto LAB_001a8dfa;
        if (((_coffset | _outc) & 3U) == 0) {
          __arg = (void *)(ulong)uVar8;
          Mat::channel_range(&bottom_blob_unpacked,bottom_blob,_coffset >> 2,uVar8);
          pOVar3 = local_170;
          pMVar7 = local_190;
          if (local_184 == _outh && local_194 == _outw) {
            Mat::clone(&m,(__fn *)&bottom_blob_unpacked,(void *)0x0,_outh,__arg);
            Mat::operator=(pMVar7,&m);
            Mat::~Mat(&m);
            iVar4 = -100;
            if ((pMVar7->data == (void *)0x0) || ((long)pMVar7->c * pMVar7->cstep == 0))
            goto LAB_001a911b;
          }
          Mat::create(pMVar7,_outw,_outh,_outc / 4,(uVar5 >> 2) << (uVar2 == 0) * '\x02',4,
                      pOVar3->blob_allocator);
          iVar4 = -100;
          if ((pMVar7->data != (void *)0x0) &&
             (uVar5 = (ulong)pMVar7->c, pMVar7->cstep * uVar5 != 0)) {
            iVar4 = 0;
            for (iVar6 = 0; iVar6 < (int)uVar5; iVar6 = iVar6 + 1) {
              Mat::channel(&m,&bottom_blob_unpacked,iVar6);
              Mat::channel(&borderm,pMVar7,iVar6);
              crop_pack4_sse(&m,&borderm,_hoffset,_woffset);
              Mat::~Mat(&borderm);
              Mat::~Mat(&m);
              uVar5 = (ulong)(uint)pMVar7->c;
            }
          }
          goto LAB_001a911b;
        }
        break;
      case 4:
        uVar2 = _outc & 3;
        if ((((_outw == local_194) && (_outh == local_184)) && (_outd == local_160)) &&
           (((_outc & 3U) == 0 && (_outc / (int)((uint)((_outc & 3U) == 0) * 3 + 1) == local_164))))
        goto LAB_001a8dfa;
        if (((_coffset | _outc) & 3U) == 0) {
          iVar4 = -100;
          Mat::channel_range(&bottom_blob_unpacked,bottom_blob,_coffset >> 2,uVar8);
          pMVar7 = local_190;
          if (local_160 == _outd && (local_184 == _outh && local_194 == _outw)) {
            Mat::clone(&m,(__fn *)&bottom_blob_unpacked,(void *)0x0,_outd,(void *)(ulong)(uint)_outh
                      );
            pMVar7 = local_190;
            Mat::operator=(local_190,&m);
            Mat::~Mat(&m);
            if ((pMVar7->data == (void *)0x0) || ((long)pMVar7->c * pMVar7->cstep == 0))
            goto LAB_001a911b;
          }
          Mat::create(pMVar7,_outw,_outh,_outd,_outc / 4,(uVar5 >> 2) << (uVar2 == 0) * '\x02',4,
                      local_170->blob_allocator);
          if ((pMVar7->data != (void *)0x0) &&
             (uVar5 = (ulong)pMVar7->c, pMVar7->cstep * uVar5 != 0)) {
            for (iVar4 = 0; iVar4 < (int)uVar5; iVar4 = iVar4 + 1) {
              for (iVar6 = 0; iVar6 < _outd; iVar6 = iVar6 + 1) {
                Mat::channel(&borderm,&bottom_blob_unpacked,iVar4);
                Mat::depth(&m,&borderm,_doffset + iVar6);
                Mat::~Mat(&borderm);
                Mat::channel(&local_78,local_190,iVar4);
                Mat::depth(&borderm,&local_78,iVar6);
                Mat::~Mat(&local_78);
                crop_pack4_sse(&m,&borderm,_hoffset,_woffset);
                Mat::~Mat(&borderm);
                Mat::~Mat(&m);
              }
              uVar5 = (ulong)(uint)local_190->c;
            }
            iVar4 = 0;
          }
          goto LAB_001a911b;
        }
      }
    }
  }
  Mat::Mat(&bottom_blob_unpacked,bottom_blob);
  if (iVar4 != 1) {
    m.data = *(void **)opt;
    m.elemsize = (size_t)opt->workspace_allocator;
    m.elempack = opt->openmp_blocktime;
    m._28_1_ = opt->use_winograd_convolution;
    m._29_1_ = opt->use_sgemm_convolution;
    m._30_1_ = opt->use_int8_inference;
    m._31_1_ = opt->use_vulkan_compute;
    m.allocator = *(Allocator **)&opt->use_bf16_storage;
    m._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    m._48_8_ = *(undefined8 *)&opt->flush_denormals;
    m._56_8_ = *(undefined8 *)&opt->use_reserved_4;
    m.refcount = (int *)opt->workspace_allocator;
    convert_packing(bottom_blob,&bottom_blob_unpacked,1,(Option *)&m);
  }
  iVar4 = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),
                        &bottom_blob_unpacked,local_190,opt);
LAB_001a911b:
  Mat::~Mat(&bottom_blob_unpacked);
  return iVar4;
}

Assistant:

int Crop_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
#if __AVX__
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
#if __AVX__
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}